

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O1

void __thiscall
pstore::broker::
bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
::eraser<int>(bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
              *this,int *r2)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  pVar4;
  
  p_Var3 = (this->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->right_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*r2 <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < *r2];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (__position._M_node = p_Var2, *r2 < (int)p_Var2[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    return;
  }
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)this,(key_type *)__position._M_node[1]._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)this,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string_const*>,std::_Select1st<std::pair<int_const,std::__cxx11::string_const*>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
  ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::__cxx11::string_const*>,std::_Select1st<std::pair<int_const,std::__cxx11::string_const*>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
                      *)&this->right_,__position);
  return;
}

Assistant:

void bimap<L, R, Lcmp, Rcmp>::eraser (R2 const & r2) {
            auto it = right_.find (r2);
            if (it != std::end (right_)) {
                auto & a = *it->second;
                left_.erase (a);
                right_.erase (it);
            }
        }